

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_CanonicalizeExactRefs_Test::TestBody(TypeTest_CanonicalizeExactRefs_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Field> __l_01;
  initializer_list<wasm::Field> __l_02;
  initializer_list<wasm::Field> __l_03;
  initializer_list<wasm::Field> __l_04;
  bool bVar1;
  HeapType HVar2;
  Type TVar3;
  Type type;
  char *pcVar4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar5;
  reference pvVar6;
  char *in_R9;
  Entry EVar7;
  AssertHelper local_630;
  Message local_628;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_10;
  Message local_608;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_9;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_8;
  Message local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_7;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_6;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_5;
  Message local_568;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_4;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_3;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_2;
  Message local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_4b0;
  AssertHelper local_490;
  Message local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  allocator<wasm::Field> local_439;
  uintptr_t local_438;
  Field local_430;
  iterator local_420;
  size_type local_418;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_410;
  Struct local_3f8;
  Entry local_3e0;
  allocator<wasm::Field> local_3c9;
  uintptr_t local_3c8;
  Field local_3c0;
  iterator local_3b0;
  size_type local_3a8;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_3a0;
  Struct local_388;
  Entry local_370;
  uintptr_t local_360;
  Type local_358;
  Type ref4;
  Type ref0;
  Entry local_328;
  uintptr_t local_318;
  Entry local_310;
  TypeBuilder *local_300;
  Entry local_2f8;
  uintptr_t local_2e8;
  Entry local_2e0;
  TypeBuilder *local_2d0;
  Entry local_2c8;
  uintptr_t local_2b8;
  Entry local_2b0;
  TypeBuilder *local_2a0;
  Entry local_298;
  uintptr_t local_288;
  Entry local_280;
  anon_class_8_1_911e227b local_270;
  anon_class_8_1_911e227b translate;
  allocator<wasm::Field> local_251;
  uintptr_t local_250;
  Field local_248;
  iterator local_238;
  size_type local_230;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_228;
  Struct local_210;
  Entry local_1f8;
  allocator<wasm::Field> local_1e1;
  uintptr_t local_1e0;
  Field local_1d8;
  iterator local_1c8;
  size_type local_1c0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_1b8;
  Struct local_1a0;
  Entry local_188;
  allocator<wasm::Field> local_171;
  uintptr_t local_170;
  Field local_168;
  iterator local_158;
  size_type local_150;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_148;
  Struct local_130;
  Entry local_118;
  allocator<wasm::Field> local_101;
  uintptr_t local_100;
  Field local_f8;
  iterator local_e8;
  size_type local_e0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_d8;
  Struct local_c0;
  Entry local_a8;
  uintptr_t local_98;
  Type local_90;
  Type d;
  Type c;
  Type b;
  Entry local_38;
  uintptr_t local_28;
  Type local_20;
  Type a;
  TypeBuilder builder;
  TypeTest_CanonicalizeExactRefs_Test *this_local;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&a,10);
  local_38 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,0);
  local_28 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_38);
  local_20.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)local_28,Exact);
  EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,1);
  c.id = (uintptr_t)EVar7.builder;
  HVar2 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&c);
  TVar3.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)HVar2.id,Inexact);
  EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,2);
  d.id = (uintptr_t)EVar7.builder;
  HVar2 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&d);
  type.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)HVar2.id,Exact);
  local_a8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,3);
  local_98 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_a8);
  local_90.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)local_98,Inexact);
  local_100 = local_20.id;
  ::wasm::Field::Field(&local_f8,local_20,Mutable);
  local_e8 = &local_f8;
  local_e0 = 1;
  std::allocator<wasm::Field>::allocator(&local_101);
  __l_04._M_len = local_e0;
  __l_04._M_array = local_e8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_d8,__l_04,&local_101);
  ::wasm::Struct::Struct(&local_c0,&local_d8);
  local_118 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_118,&local_c0);
  ::wasm::Struct::~Struct(&local_c0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_d8);
  std::allocator<wasm::Field>::~allocator(&local_101);
  local_170 = TVar3.id;
  ::wasm::Field::Field(&local_168,TVar3,Mutable);
  local_158 = &local_168;
  local_150 = 1;
  std::allocator<wasm::Field>::allocator(&local_171);
  __l_03._M_len = local_150;
  __l_03._M_array = local_158;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_148,__l_03,&local_171);
  ::wasm::Struct::Struct(&local_130,&local_148);
  local_188 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_188,&local_130);
  ::wasm::Struct::~Struct(&local_130);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_148);
  std::allocator<wasm::Field>::~allocator(&local_171);
  local_1e0 = type.id;
  ::wasm::Field::Field(&local_1d8,type,Mutable);
  local_1c8 = &local_1d8;
  local_1c0 = 1;
  std::allocator<wasm::Field>::allocator(&local_1e1);
  __l_02._M_len = local_1c0;
  __l_02._M_array = local_1c8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_1b8,__l_02,&local_1e1);
  ::wasm::Struct::Struct(&local_1a0,&local_1b8);
  local_1f8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,2);
  ::wasm::TypeBuilder::Entry::operator=(&local_1f8,&local_1a0);
  ::wasm::Struct::~Struct(&local_1a0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_1b8);
  std::allocator<wasm::Field>::~allocator(&local_1e1);
  local_250 = local_90.id;
  ::wasm::Field::Field(&local_248,local_90,Mutable);
  local_238 = &local_248;
  local_230 = 1;
  std::allocator<wasm::Field>::allocator(&local_251);
  __l_01._M_len = local_230;
  __l_01._M_array = local_238;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_228,__l_01,&local_251);
  ::wasm::Struct::Struct(&local_210,&local_228);
  EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,3);
  translate.builder = EVar7.builder;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&translate,&local_210);
  ::wasm::Struct::~Struct(&local_210);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_228);
  std::allocator<wasm::Field>::~allocator(&local_251);
  local_270.builder = (TypeBuilder *)&a;
  local_280 = ::wasm::TypeBuilder::operator[](local_270.builder,4);
  local_298 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,0);
  local_288 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_298);
  local_2a0 = local_270.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
            (&local_280,(HeapType)local_288,local_270);
  local_2b0 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,5);
  local_2c8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,1);
  local_2b8 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_2c8);
  local_2d0 = local_270.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
            (&local_2b0,(HeapType)local_2b8,local_270);
  local_2e0 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,6);
  local_2f8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,2);
  local_2e8 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_2f8);
  local_300 = local_270.builder;
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
            (&local_2e0,(HeapType)local_2e8,local_270);
  local_310 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,7);
  local_328 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,3);
  local_318 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_328);
  ::wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
            (&local_310,(HeapType)local_318,local_270);
  EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,0);
  ref4.id = (uintptr_t)EVar7.builder;
  HVar2 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&ref4);
  TVar3.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)HVar2.id,Exact);
  local_370 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,4);
  local_360 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_370);
  local_358.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&a,(Nullability)local_360,Exact);
  local_3c8 = TVar3.id;
  ::wasm::Field::Field(&local_3c0,TVar3,Mutable);
  local_3b0 = &local_3c0;
  local_3a8 = 1;
  std::allocator<wasm::Field>::allocator(&local_3c9);
  __l_00._M_len = local_3a8;
  __l_00._M_array = local_3b0;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_3a0,__l_00,&local_3c9);
  ::wasm::Struct::Struct(&local_388,&local_3a0);
  local_3e0 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,8);
  ::wasm::TypeBuilder::Entry::operator=(&local_3e0,&local_388);
  ::wasm::Struct::~Struct(&local_388);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_3a0);
  std::allocator<wasm::Field>::~allocator(&local_3c9);
  local_438 = local_358.id;
  ::wasm::Field::Field(&local_430,local_358,Mutable);
  local_420 = &local_430;
  local_418 = 1;
  std::allocator<wasm::Field>::allocator(&local_439);
  __l._M_len = local_418;
  __l._M_array = local_420;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_410,__l,&local_439);
  ::wasm::Struct::Struct(&local_3f8,&local_410);
  EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&a,9);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar7.builder;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_3f8);
  ::wasm::Struct::~Struct(&local_3f8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_410);
  std::allocator<wasm::Field>::~allocator(&local_439);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_480,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b0,(internal *)local_480,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x1d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_4e0,"built[0]","built[4]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
    if (!bVar1) {
      testing::Message::Message(&local_4e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1d6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_4e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,5);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_500,"built[1]","built[5]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar1) {
      testing::Message::Message(&local_508);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1d7,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_508);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_508);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,6);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_520,"built[2]","built[6]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
    if (!bVar1) {
      testing::Message::Message(&local_528);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1d8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_528);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_528);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,7);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_540,"built[3]","built[7]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
    if (!bVar1) {
      testing::Message::Message(&local_548);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1d9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_548);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_548);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,8);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,9);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_560,"built[8]","built[9]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
    if (!bVar1) {
      testing::Message::Message(&local_568);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1db,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_568);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_568);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_580,"built[0]","built[1]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
    if (!bVar1) {
      testing::Message::Message(&local_588);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1dd,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_588);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_588);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_5a0,"built[0]","built[2]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
    if (!bVar1) {
      testing::Message::Message(&local_5a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1de,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_5a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_5a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_5c0,"built[0]","built[3]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
    if (!bVar1) {
      testing::Message::Message(&local_5c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1df,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_5c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_5e0,"built[1]","built[2]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
    if (!bVar1) {
      testing::Message::Message(&local_5e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1e0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_5e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_5e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_600,"built[1]","built[3]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      testing::Message::Message(&local_608);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1e1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_608);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_608);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_620,"built[2]","built[3]",pvVar5,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
    if (!bVar1) {
      testing::Message::Message(&local_628);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
      testing::internal::AssertHelper::AssertHelper
                (&local_630,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1e2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_630,&local_628);
      testing::internal::AssertHelper::~AssertHelper(&local_630);
      testing::Message::~Message(&local_628);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&a);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeExactRefs) {
  TypeBuilder builder(10);

  // Types that vary in exactness or nullability of references are different.
  Type a = builder.getTempRefType(builder[0], Nullable, Inexact);
  Type b = builder.getTempRefType(builder[1], NonNullable, Inexact);
  Type c = builder.getTempRefType(builder[2], Nullable, Exact);
  Type d = builder.getTempRefType(builder[3], NonNullable, Exact);

  builder[0] = Struct({Field(a, Mutable)});
  builder[1] = Struct({Field(b, Mutable)});
  builder[2] = Struct({Field(c, Mutable)});
  builder[3] = Struct({Field(d, Mutable)});

  auto translate = [&](HeapType t) -> HeapType {
    for (int i = 0; i < 4; ++i) {
      if (t == builder[i]) {
        return builder[4 + i];
      }
    }
    WASM_UNREACHABLE("unexpected type");
  };

  builder[4].copy(builder[0], translate);
  builder[5].copy(builder[1], translate);
  builder[6].copy(builder[2], translate);
  builder[7].copy(builder[3], translate);

  // Test with references to previous types as well.
  Type ref0 = builder.getTempRefType(builder[0], Nullable, Exact);
  Type ref4 = builder.getTempRefType(builder[4], Nullable, Exact);

  builder[8] = Struct({Field(ref0, Mutable)});
  builder[9] = Struct({Field(ref4, Mutable)});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[4]);
  EXPECT_EQ(built[1], built[5]);
  EXPECT_EQ(built[2], built[6]);
  EXPECT_EQ(built[3], built[7]);

  EXPECT_EQ(built[8], built[9]);

  EXPECT_NE(built[0], built[1]);
  EXPECT_NE(built[0], built[2]);
  EXPECT_NE(built[0], built[3]);
  EXPECT_NE(built[1], built[2]);
  EXPECT_NE(built[1], built[3]);
  EXPECT_NE(built[2], built[3]);
}